

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert
          (SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this,TypeBase **key)

{
  uint uVar1;
  TypeBase *pTVar2;
  TypeBase *pTVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  if (*key == (TypeBase *)0x0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
                 );
  }
  uVar4 = this->bucketCount;
  if (uVar4 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar4 = this->bucketCount;
    if (uVar4 == 0) goto LAB_0018b910;
  }
  uVar1 = uVar4 - 1;
  pTVar2 = *key;
  uVar5 = pTVar2->nameHash;
  iVar6 = 0;
  do {
    uVar5 = uVar5 & uVar1;
    pTVar3 = this->data[uVar5];
    if (pTVar3 == (TypeBase *)0x0) {
      this->data[uVar5] = pTVar2;
      this->count = this->count + 1;
      return;
    }
    if (pTVar3 == pTVar2) {
      return;
    }
    uVar5 = uVar5 + iVar6 + 1;
    iVar6 = iVar6 + 1;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
LAB_0018b910:
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0xf5,
                "void SmallDenseSet<TypeBase *, TypeBaseHasher, 4>::insert(const Key &) [Key = TypeBase *, Hasher = TypeBaseHasher, N = 4]"
               );
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}